

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,void **vtt)

{
  long *plVar1;
  void **in_RSI;
  TPZIntelGen<pzshape::TPZShapePrism> *in_RDI;
  int i;
  TPZIntelGen<pzshape::TPZShapePrism> *size;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar2;
  
  TPZIntelGen<pzshape::TPZShapePrism>::TPZIntelGen(in_RDI,in_RSI);
  *(void **)&(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.super_TPZCompEl =
       *in_RSI;
  *(void **)(&(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.super_TPZCompEl.
              field_0x0 +
            *(long *)(*(long *)&(in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.
                                super_TPZCompEl + -0x60)) = in_RSI[9];
  size = in_RDI + 1;
  TPZManVector<int,_5>::TPZManVector((TPZManVector<int,_5> *)in_RDI,(int64_t)in_RSI);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1a14684);
  TPZManVector<long,_6>::TPZManVector
            ((TPZManVector<long,_6> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (int64_t)size,(long *)in_RDI);
  *(undefined4 *)&in_RDI[2].fIntRule.super_TPZIntPoints._vptr_TPZIntPoints = 0;
  (in_RDI->super_TPZInterpolatedElement).super_TPZInterpolationSpace.fPreferredOrder = -1;
  for (iVar2 = 0; iVar2 < 0x15; iVar2 = iVar2 + 1) {
    plVar1 = TPZVec<long>::operator[]
                       ((TPZVec<long> *)&in_RDI[1].fIntRule.fIntRule1D.fIntP,(long)iVar2);
    *plVar1 = -1;
  }
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv() :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>()
{
	this->fPreferredOrder = -1;
	int i;
	for(i=0;i<TSHAPE::NSides;i++) {
		this-> fConnectIndexes[i] = -1;
	}

}